

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O2

ssize_t __thiscall
duckdb_parquet::FileMetaData::read(FileMetaData *this,int __fd,void *__buf,size_t __nbytes)

{
  vector<duckdb_parquet::RowGroup,_true> *this_00;
  vector<duckdb_parquet::SchemaElement,_true> *this_01;
  int iVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  reference pvVar4;
  undefined4 extraout_var_00;
  reference pvVar5;
  ssize_t sVar6;
  reference pvVar7;
  reference pvVar8;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined8 *puVar9;
  void *__buf_00;
  undefined4 in_register_00000034;
  TProtocol *this_02;
  vector<duckdb_parquet::KeyValue,_true> *this_03;
  vector<duckdb_parquet::ColumnOrder,_true> *this_04;
  ulong uVar10;
  uint32_t _size229;
  TType _etype232;
  int16_t fid;
  FileMetaData *local_b8;
  TType ftype;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_90;
  vector<duckdb_parquet::KeyValue,_true> *local_88;
  vector<duckdb_parquet::ColumnOrder,_true> *local_80;
  int32_t *local_78;
  int64_t *local_70;
  string *local_68;
  EncryptionAlgorithm *local_60;
  string *local_58;
  string fname;
  
  this_02 = (TProtocol *)CONCAT44(in_register_00000034,__fd);
  duckdb_apache::thrift::protocol::TProtocol::incrementInputRecursionDepth(this_02);
  fname._M_dataplus._M_p = (pointer)&fname.field_2;
  fname._M_string_length = 0;
  fname.field_2._M_local_buf[0] = '\0';
  iVar1 = (*this_02->_vptr_TProtocol[0x19])(this_02,&fname);
  local_58 = &this->footer_signing_key_metadata;
  local_60 = &this->encryption_algorithm;
  local_80 = &this->column_orders;
  local_68 = &this->created_by;
  local_88 = &this->key_value_metadata;
  this_00 = &this->row_groups;
  local_70 = &this->num_rows;
  this_01 = &this->schema;
  local_78 = &this->version;
  local_90 = 0;
  local_a0 = 0;
  local_98 = 0;
  local_a8 = 0;
  local_b8 = this;
  do {
    iVar2 = (*this_02->_vptr_TProtocol[0x1b])(this_02,&fname,&ftype,&fid);
    this_04 = local_80;
    this_03 = local_88;
    iVar2 = iVar2 + iVar1;
    if (ftype == T_STOP) {
      iVar1 = (*this_02->_vptr_TProtocol[0x1a])(this_02);
      if (((byte)local_98 & (byte)local_a8 & (byte)local_90 & (byte)local_a0 & 1) == 0) {
        puVar9 = (undefined8 *)__cxa_allocate_exception(0x30);
        puVar9[1] = puVar9 + 3;
        puVar9[2] = 0;
        *(undefined1 *)(puVar9 + 3) = 0;
        *puVar9 = &PTR__TException_027cc470;
        *(undefined4 *)(puVar9 + 5) = 1;
        __cxa_throw(puVar9,&duckdb_apache::thrift::protocol::TProtocolException::typeinfo,
                    duckdb_apache::thrift::TException::~TException);
      }
      std::__cxx11::string::~string((string *)&fname);
      this_02->input_recursion_depth_ = this_02->input_recursion_depth_ - 1;
      return (ulong)(uint)(iVar1 + iVar2);
    }
    switch(fid) {
    case 1:
      if (ftype != T_I32) {
        iVar3 = (*this_02->_vptr_TProtocol[0x2c])(this_02);
        break;
      }
      iVar1 = (*this_02->_vptr_TProtocol[0x27])(this_02,local_78);
      iVar3 = iVar1 + iVar2;
      local_90 = CONCAT71((int7)(CONCAT44(extraout_var,iVar1) >> 8),1);
      goto LAB_01dda8ec;
    case 2:
      if (ftype == T_LIST) {
        std::vector<duckdb_parquet::SchemaElement,_std::allocator<duckdb_parquet::SchemaElement>_>::
        clear(&this_01->
               super_vector<duckdb_parquet::SchemaElement,_std::allocator<duckdb_parquet::SchemaElement>_>
             );
        iVar3 = (*this_02->_vptr_TProtocol[0x1f])(this_02,&_etype232,&_size229);
        std::vector<duckdb_parquet::SchemaElement,_std::allocator<duckdb_parquet::SchemaElement>_>::
        resize(&this_01->
                super_vector<duckdb_parquet::SchemaElement,_std::allocator<duckdb_parquet::SchemaElement>_>
               ,(ulong)_size229);
        iVar3 = iVar3 + iVar2;
        for (uVar10 = 0; uVar10 < _size229; uVar10 = uVar10 + 1) {
          pvVar7 = duckdb::vector<duckdb_parquet::SchemaElement,_true>::get<true>(this_01,uVar10);
          iVar1 = (**(code **)(*(long *)pvVar7 + 0x10))(pvVar7,this_02);
          iVar3 = iVar3 + iVar1;
        }
        iVar1 = (*this_02->_vptr_TProtocol[0x20])(this_02);
        iVar3 = iVar1 + iVar3;
        local_a0 = CONCAT71((int7)(CONCAT44(extraout_var_02,iVar1) >> 8),1);
        goto LAB_01dda8ec;
      }
      iVar3 = (*this_02->_vptr_TProtocol[0x2c])(this_02);
      break;
    case 3:
      if (ftype == T_I64) {
        iVar1 = (*this_02->_vptr_TProtocol[0x28])(this_02,local_70);
        iVar3 = iVar1 + iVar2;
        local_98 = CONCAT71((int7)(CONCAT44(extraout_var_00,iVar1) >> 8),1);
        goto LAB_01dda8ec;
      }
      iVar3 = (*this_02->_vptr_TProtocol[0x2c])(this_02);
      break;
    case 4:
      if (ftype == T_LIST) {
        std::vector<duckdb_parquet::RowGroup,_std::allocator<duckdb_parquet::RowGroup>_>::clear
                  (&this_00->
                    super_vector<duckdb_parquet::RowGroup,_std::allocator<duckdb_parquet::RowGroup>_>
                  );
        iVar3 = (*this_02->_vptr_TProtocol[0x1f])(this_02,&_etype232,&_size229);
        std::vector<duckdb_parquet::RowGroup,_std::allocator<duckdb_parquet::RowGroup>_>::resize
                  (&this_00->
                    super_vector<duckdb_parquet::RowGroup,_std::allocator<duckdb_parquet::RowGroup>_>
                   ,(ulong)_size229);
        iVar3 = iVar3 + iVar2;
        for (uVar10 = 0; uVar10 < _size229; uVar10 = uVar10 + 1) {
          pvVar5 = duckdb::vector<duckdb_parquet::RowGroup,_true>::get<true>(this_00,uVar10);
          iVar1 = (**(code **)(*(long *)pvVar5 + 0x10))(pvVar5,this_02);
          iVar3 = iVar3 + iVar1;
        }
        iVar1 = (*this_02->_vptr_TProtocol[0x20])(this_02);
        iVar3 = iVar1 + iVar3;
        local_a8 = CONCAT71((int7)(CONCAT44(extraout_var_01,iVar1) >> 8),1);
        goto LAB_01dda8ec;
      }
      iVar3 = (*this_02->_vptr_TProtocol[0x2c])(this_02);
      break;
    case 5:
      if (ftype == T_LIST) {
        std::vector<duckdb_parquet::KeyValue,_std::allocator<duckdb_parquet::KeyValue>_>::clear
                  (&local_88->
                    super_vector<duckdb_parquet::KeyValue,_std::allocator<duckdb_parquet::KeyValue>_>
                  );
        iVar1 = (*this_02->_vptr_TProtocol[0x1f])(this_02,&_etype232,&_size229);
        std::vector<duckdb_parquet::KeyValue,_std::allocator<duckdb_parquet::KeyValue>_>::resize
                  (&this_03->
                    super_vector<duckdb_parquet::KeyValue,_std::allocator<duckdb_parquet::KeyValue>_>
                   ,(ulong)_size229);
        iVar1 = iVar1 + iVar2;
        for (uVar10 = 0; uVar10 < _size229; uVar10 = uVar10 + 1) {
          pvVar4 = duckdb::vector<duckdb_parquet::KeyValue,_true>::get<true>(this_03,uVar10);
          iVar2 = (**(code **)(*(long *)pvVar4 + 0x10))(pvVar4,this_02);
          iVar1 = iVar1 + iVar2;
          this_03 = local_88;
        }
        iVar3 = (*this_02->_vptr_TProtocol[0x20])(this_02);
        iVar3 = iVar3 + iVar1;
        local_b8->__isset = (_FileMetaData__isset)((byte)local_b8->__isset | 1);
        goto LAB_01dda8ec;
      }
      iVar3 = (*this_02->_vptr_TProtocol[0x2c])(this_02);
      break;
    case 6:
      if (ftype == T_STRING) {
        iVar3 = (*this_02->_vptr_TProtocol[0x2a])(this_02,local_68);
        iVar3 = iVar3 + iVar2;
        local_b8->__isset = (_FileMetaData__isset)((byte)local_b8->__isset | 2);
        goto LAB_01dda8ec;
      }
      iVar3 = (*this_02->_vptr_TProtocol[0x2c])(this_02);
      break;
    case 7:
      if (ftype == T_LIST) {
        std::vector<duckdb_parquet::ColumnOrder,_std::allocator<duckdb_parquet::ColumnOrder>_>::
        clear(&local_80->
               super_vector<duckdb_parquet::ColumnOrder,_std::allocator<duckdb_parquet::ColumnOrder>_>
             );
        iVar1 = (*this_02->_vptr_TProtocol[0x1f])(this_02,&_etype232,&_size229);
        std::vector<duckdb_parquet::ColumnOrder,_std::allocator<duckdb_parquet::ColumnOrder>_>::
        resize(&this_04->
                super_vector<duckdb_parquet::ColumnOrder,_std::allocator<duckdb_parquet::ColumnOrder>_>
               ,(ulong)_size229);
        iVar1 = iVar1 + iVar2;
        for (uVar10 = 0; uVar10 < _size229; uVar10 = uVar10 + 1) {
          pvVar8 = duckdb::vector<duckdb_parquet::ColumnOrder,_true>::get<true>(this_04,uVar10);
          iVar2 = (**(code **)(*(long *)pvVar8 + 0x10))(pvVar8,this_02);
          iVar1 = iVar1 + iVar2;
          this_04 = local_80;
        }
        iVar3 = (*this_02->_vptr_TProtocol[0x20])(this_02);
        iVar3 = iVar3 + iVar1;
        local_b8->__isset = (_FileMetaData__isset)((byte)local_b8->__isset | 4);
        goto LAB_01dda8ec;
      }
      iVar3 = (*this_02->_vptr_TProtocol[0x2c])(this_02);
      break;
    case 8:
      if (ftype == T_STRUCT) {
        sVar6 = EncryptionAlgorithm::read(local_60,__fd,__buf_00,0x204caec);
        iVar3 = (int)sVar6 + iVar2;
        local_b8->__isset = (_FileMetaData__isset)((byte)local_b8->__isset | 8);
        goto LAB_01dda8ec;
      }
      iVar3 = (*this_02->_vptr_TProtocol[0x2c])(this_02);
      break;
    case 9:
      if (ftype == T_STRING) {
        iVar3 = (*this_02->_vptr_TProtocol[0x2b])(this_02,local_58);
        iVar3 = iVar3 + iVar2;
        local_b8->__isset = (_FileMetaData__isset)((byte)local_b8->__isset | 0x10);
        goto LAB_01dda8ec;
      }
      iVar3 = (*this_02->_vptr_TProtocol[0x2c])(this_02);
      break;
    default:
      iVar3 = (*this_02->_vptr_TProtocol[0x2c])(this_02);
    }
    iVar3 = iVar3 + iVar2;
LAB_01dda8ec:
    iVar1 = (*this_02->_vptr_TProtocol[0x1c])(this_02);
    iVar1 = iVar1 + iVar3;
  } while( true );
}

Assistant:

uint32_t FileMetaData::read(::apache::thrift::protocol::TProtocol* iprot) {

  ::apache::thrift::protocol::TInputRecursionTracker tracker(*iprot);
  uint32_t xfer = 0;
  std::string fname;
  ::apache::thrift::protocol::TType ftype;
  int16_t fid;

  xfer += iprot->readStructBegin(fname);

  using ::apache::thrift::protocol::TProtocolException;

  bool isset_version = false;
  bool isset_schema = false;
  bool isset_num_rows = false;
  bool isset_row_groups = false;

  while (true)
  {
    xfer += iprot->readFieldBegin(fname, ftype, fid);
    if (ftype == ::apache::thrift::protocol::T_STOP) {
      break;
    }
    switch (fid)
    {
      case 1:
        if (ftype == ::apache::thrift::protocol::T_I32) {
          xfer += iprot->readI32(this->version);
          isset_version = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 2:
        if (ftype == ::apache::thrift::protocol::T_LIST) {
          {
            this->schema.clear();
            uint32_t _size219;
            ::apache::thrift::protocol::TType _etype222;
            xfer += iprot->readListBegin(_etype222, _size219);
            this->schema.resize(_size219);
            uint32_t _i223;
            for (_i223 = 0; _i223 < _size219; ++_i223)
            {
              xfer += this->schema[_i223].read(iprot);
            }
            xfer += iprot->readListEnd();
          }
          isset_schema = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 3:
        if (ftype == ::apache::thrift::protocol::T_I64) {
          xfer += iprot->readI64(this->num_rows);
          isset_num_rows = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 4:
        if (ftype == ::apache::thrift::protocol::T_LIST) {
          {
            this->row_groups.clear();
            uint32_t _size224;
            ::apache::thrift::protocol::TType _etype227;
            xfer += iprot->readListBegin(_etype227, _size224);
            this->row_groups.resize(_size224);
            uint32_t _i228;
            for (_i228 = 0; _i228 < _size224; ++_i228)
            {
              xfer += this->row_groups[_i228].read(iprot);
            }
            xfer += iprot->readListEnd();
          }
          isset_row_groups = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 5:
        if (ftype == ::apache::thrift::protocol::T_LIST) {
          {
            this->key_value_metadata.clear();
            uint32_t _size229;
            ::apache::thrift::protocol::TType _etype232;
            xfer += iprot->readListBegin(_etype232, _size229);
            this->key_value_metadata.resize(_size229);
            uint32_t _i233;
            for (_i233 = 0; _i233 < _size229; ++_i233)
            {
              xfer += this->key_value_metadata[_i233].read(iprot);
            }
            xfer += iprot->readListEnd();
          }
          this->__isset.key_value_metadata = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 6:
        if (ftype == ::apache::thrift::protocol::T_STRING) {
          xfer += iprot->readString(this->created_by);
          this->__isset.created_by = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 7:
        if (ftype == ::apache::thrift::protocol::T_LIST) {
          {
            this->column_orders.clear();
            uint32_t _size234;
            ::apache::thrift::protocol::TType _etype237;
            xfer += iprot->readListBegin(_etype237, _size234);
            this->column_orders.resize(_size234);
            uint32_t _i238;
            for (_i238 = 0; _i238 < _size234; ++_i238)
            {
              xfer += this->column_orders[_i238].read(iprot);
            }
            xfer += iprot->readListEnd();
          }
          this->__isset.column_orders = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 8:
        if (ftype == ::apache::thrift::protocol::T_STRUCT) {
          xfer += this->encryption_algorithm.read(iprot);
          this->__isset.encryption_algorithm = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 9:
        if (ftype == ::apache::thrift::protocol::T_STRING) {
          xfer += iprot->readBinary(this->footer_signing_key_metadata);
          this->__isset.footer_signing_key_metadata = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      default:
        xfer += iprot->skip(ftype);
        break;
    }
    xfer += iprot->readFieldEnd();
  }

  xfer += iprot->readStructEnd();

  if (!isset_version)
    throw TProtocolException(TProtocolException::INVALID_DATA);
  if (!isset_schema)
    throw TProtocolException(TProtocolException::INVALID_DATA);
  if (!isset_num_rows)
    throw TProtocolException(TProtocolException::INVALID_DATA);
  if (!isset_row_groups)
    throw TProtocolException(TProtocolException::INVALID_DATA);
  return xfer;
}